

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9ValidRequireExplicitPolicyTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section9ValidRequireExplicitPolicyTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_f8 [8];
  PkitsTestInfo info;
  char *crls [5];
  char *pcStack_48;
  char *certs [6];
  Section9ValidRequireExplicitPolicyTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  certs[3] = "requireExplicitPolicy0subsubsubCACert";
  certs[4] = "ValidrequireExplicitPolicyTest4EE";
  certs[1] = "requireExplicitPolicy0subCACert";
  certs[2] = "requireExplicitPolicy0subsubCACert";
  pcStack_48 = "TrustAnchorRootCertificate";
  certs[0] = "requireExplicitPolicy0CACert";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_f8);
  local_f8 = (undefined1  [8])0x6f5a65;
  info.time.year._0_1_ = 1;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<6ul,5ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [6])&pcStack_48,
             (char *(*) [5])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_f8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_f8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9ValidRequireExplicitPolicyTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy0CACert",
                               "requireExplicitPolicy0subCACert",
                               "requireExplicitPolicy0subsubCACert",
                               "requireExplicitPolicy0subsubsubCACert",
                               "ValidrequireExplicitPolicyTest4EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "requireExplicitPolicy0CACRL",
      "requireExplicitPolicy0subCACRL", "requireExplicitPolicy0subsubCACRL",
      "requireExplicitPolicy0subsubsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.4";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}